

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O0

void __thiscall
iu_TypedTest_x_iutest_x_StaticMul2_Test<long>::Body
          (iu_TypedTest_x_iutest_x_StaticMul2_Test<long> *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_210;
  Fixed local_1d0;
  long local_48;
  long local_40;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_TypedTest_x_iutest_x_StaticMul2_Test<long> *this_local;
  
  TypedTest<long>::value = 1;
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40 = TypedTest<long>::value * 2;
  local_48 = TypedTest<long>::value << 1;
  iutest::internal::backward::EqHelper<false>::Compare<long>
            ((AssertionResult *)local_38,"TestFixture::value+TestFixture::value",
             "2*TestFixture::value",&local_40,&local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
               ,0x2f,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, StaticMul2)
{
    TestFixture::value = 1;
    IUTEST_ASSERT_EQ(TestFixture::value+TestFixture::value, 2*TestFixture::value);
}